

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_write(int hdl,void *buffer,long nbytes)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  LONGLONG local_40;
  size_t local_38;
  char *ptr;
  size_t newsize;
  long nbytes_local;
  void *buffer_local;
  int hdl_local;
  
  if (*memTable[hdl].memsizeptr < (ulong)(memTable[hdl].currentpos + nbytes)) {
    if (memTable[hdl].mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) {
      ffpmsg("realloc function not defined (mem_write)");
      return 0x6a;
    }
    uVar1 = ((memTable[hdl].currentpos + nbytes + -1) / 0xb40 + 1) * 0xb40;
    uVar3 = *memTable[hdl].memsizeptr + memTable[hdl].deltasize;
    if (uVar1 < uVar3 || uVar1 - uVar3 == 0) {
      local_38 = *memTable[hdl].memsizeptr + memTable[hdl].deltasize;
    }
    else {
      local_38 = ((memTable[hdl].currentpos + nbytes + -1) / 0xb40 + 1) * 0xb40;
    }
    pcVar2 = (char *)(*memTable[hdl].mem_realloc)(*memTable[hdl].memaddrptr,local_38);
    if (pcVar2 == (char *)0x0) {
      ffpmsg("Failed to reallocate memory (mem_write)");
      return 0x71;
    }
    *memTable[hdl].memaddrptr = pcVar2;
    *memTable[hdl].memsizeptr = local_38;
  }
  memcpy(*memTable[hdl].memaddrptr + memTable[hdl].currentpos,buffer,nbytes);
  memTable[hdl].currentpos = nbytes + memTable[hdl].currentpos;
  if (memTable[hdl].currentpos < memTable[hdl].fitsfilesize) {
    local_40 = memTable[hdl].fitsfilesize;
  }
  else {
    local_40 = memTable[hdl].currentpos;
  }
  memTable[hdl].fitsfilesize = local_40;
  return 0;
}

Assistant:

int mem_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{
    size_t newsize;
    char *ptr;

    if ((size_t) (memTable[hdl].currentpos + nbytes) > 
         *(memTable[hdl].memsizeptr) )
    {
               
        if (!(memTable[hdl].mem_realloc))
        {
            ffpmsg("realloc function not defined (mem_write)");
            return(WRITE_ERROR);
        }

        /*
          Attempt to reallocate additional memory:
          the memory buffer size is incremented by the larger of:
             1 FITS block (2880 bytes) or
             the defined 'deltasize' parameter
         */

        newsize = maxvalue( (size_t)
            (((memTable[hdl].currentpos + nbytes - 1) / 2880) + 1) * 2880,
            *(memTable[hdl].memsizeptr) + memTable[hdl].deltasize);

        /* call the realloc function */
        ptr = (memTable[hdl].mem_realloc)(
                                    *(memTable[hdl].memaddrptr),
                                     newsize);
        if (!ptr)
        {
            ffpmsg("Failed to reallocate memory (mem_write)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[hdl].memaddrptr) = ptr;
        *(memTable[hdl].memsizeptr) = newsize;
    }

    /* now copy the bytes from the buffer into memory */
    memcpy( *(memTable[hdl].memaddrptr) + memTable[hdl].currentpos,
             buffer,
             nbytes);

    memTable[hdl].currentpos += nbytes;
    memTable[hdl].fitsfilesize =
               maxvalue(memTable[hdl].fitsfilesize,
                        memTable[hdl].currentpos);
    return(0);
}